

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.hpp
# Opt level: O0

Point astar::operator+(Point *aPoint,Point *bPoint)

{
  LogStream *pLVar1;
  LogStream local_48;
  Point *local_20;
  Point *bPoint_local;
  Point *aPoint_local;
  
  local_20 = bPoint;
  bPoint_local = aPoint;
  if (((((aPoint->x < 1) || (bPoint->x <= 0x7fffffff - aPoint->x)) &&
       ((aPoint->y < 1 || (bPoint->y <= 0x7fffffff - aPoint->y)))) &&
      ((-1 < aPoint->x || (-0x80000000 - aPoint->x <= bPoint->x)))) &&
     ((-1 < aPoint->y || (-0x80000000 - aPoint->y <= bPoint->y)))) {
    Point::Point((Point *)&aPoint_local,aPoint->x + bPoint->x,aPoint->y + bPoint->y);
  }
  else {
    local_48._16_8_ = 0;
    local_48._24_8_ = 0;
    local_48.data = (string)0x0;
    local_48._1_7_ = 0;
    local_48._8_8_ = 0;
    details::LogStream::LogStream(&local_48);
    pLVar1 = details::LogStream::operator<<(&local_48,"[E: ");
    pLVar1 = details::LogStream::operator<<(pLVar1,"16:51:43");
    pLVar1 = details::LogStream::operator<<(pLVar1," ");
    pLVar1 = details::LogStream::operator<<
                       (pLVar1,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AZMDDY[P]astar/include/point.hpp"
                       );
    pLVar1 = details::LogStream::operator<<(pLVar1,":");
    pLVar1 = details::LogStream::operator<<(pLVar1,0x2a);
    pLVar1 = details::LogStream::operator<<(pLVar1,"] ");
    details::LogStream::operator<<(pLVar1,"add point is out of range.");
    details::LogStream::~LogStream(&local_48);
    Point::Point((Point *)&aPoint_local,0,0);
  }
  return (Point)aPoint_local;
}

Assistant:

Point operator+(const Point& aPoint, const Point& bPoint)
{
    if ((aPoint.x > 0 && INT32_MAX - aPoint.x < bPoint.x) || (aPoint.y > 0 && INT32_MAX - aPoint.y < bPoint.y) ||
        (aPoint.x < 0 && INT32_MIN - aPoint.x > bPoint.x) || (aPoint.y < 0 && INT32_MIN - aPoint.y > bPoint.y)) {
        ALOG() << "add point is out of range.";
        return {0, 0};
    }
    return {aPoint.x + bPoint.x, aPoint.y + bPoint.y};
}